

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicsInstanceKinematicsScene::addBindJointAxis
          (KinematicsInstanceKinematicsScene *this,KinematicsBindJointAxis *bindJointAxis)

{
  value_type *in_RDI;
  vector<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
  *unaff_retaddr;
  
  std::
  vector<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
  ::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addBindJointAxis(KinematicsBindJointAxis* bindJointAxis) { mBindJointAxes.push_back(bindJointAxis);}